

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_text.cpp
# Opt level: O3

int main(void)

{
  char text [100];
  char local_78 [112];
  
  builtin_strncpy(local_78,"hey Lou, how are you?",0x16);
  printf("Original: %s \n",local_78);
  obme::OBME_T(local_78);
  printf("Obfuscated: %s \n",local_78);
  obme::OBME_T(local_78);
  printf("Restored: %s \n",local_78);
  return 1;
}

Assistant:

int main()
{
	char text[100];
	strcpy(text, "hey Lou, how are you?");
	printf("Original: %s \n", text);
	OBME_T(text);
    
	printf("Obfuscated: %s \n", text);
	OBME_T(text);
	printf("Restored: %s \n", text);
	
	return 1;
}